

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  Dependency **ppDVar1;
  RawBrandedSchema *pRVar2;
  Schema SVar3;
  bool bVar4;
  Reader brand;
  undefined1 auVar5 [40];
  Reader reader;
  Field field;
  PointerReader reader_00;
  Reader value_00;
  Reader value_01;
  StringPtr name_00;
  undefined8 uVar6;
  Maybe<kj::_::Mutex::Waiter_&> MVar7;
  char cVar8;
  short sVar9;
  Format FVar10;
  ConstSchema constant;
  Dependency *params;
  char *pcVar12;
  char *pcVar13;
  RawSchema *pRVar14;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *extraout_RDX_02;
  Reader *extraout_RDX_03;
  Reader *extraout_RDX_04;
  Reader *extraout_RDX_05;
  Reader *extraout_RDX_06;
  Reader *extraout_RDX_07;
  Reader *params_00;
  Reader *extraout_RDX_08;
  Reader *extraout_RDX_09;
  Reader *extraout_RDX_10;
  long extraout_RDX_11;
  long lVar15;
  long extraout_RDX_12;
  RawSchema *pRVar16;
  ProcessContext *pPVar17;
  bool bVar18;
  RawSchema *pRVar19;
  bool bVar20;
  ReaderOptions options;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  StringPtr SVar21;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  ReaderFor<capnp::DynamicStruct> structValue_1;
  Schema schema;
  StringPtr partName;
  ReaderFor<capnp::DynamicList> listValue;
  Reader value;
  ReaderFor<capnp::DynamicStruct> structValue;
  IteratorInput<char,_const_char_*> input;
  word zeroWord [1];
  SegmentArrayMessageReader emptyMessage;
  ArrayPtr<const_capnp::word> segments [1];
  Fault f;
  undefined8 uVar22;
  undefined1 local_449;
  RawSchema *in_stack_fffffffffffffbc0;
  RawSchema *pRVar23;
  undefined8 in_stack_fffffffffffffbc8;
  Dependency *pDVar24;
  char *in_stack_fffffffffffffbd0;
  Dependency *pDVar25;
  Maybe<kj::_::Mutex::Waiter_&> MVar26;
  ArrayDisposer *pAVar27;
  undefined8 in_stack_fffffffffffffbf0;
  undefined1 uVar28;
  Type in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_400;
  Schema local_3b8;
  Dependency *local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [80];
  undefined1 local_348 [8];
  Dependency *local_340;
  Waiter *pWStack_338;
  ArrayDisposer *pAStack_330;
  StructSchema local_2f8;
  RawSchema *local_2f0;
  undefined1 local_2e8 [64];
  IteratorInput<char,_const_char_*> local_2a8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  Dependency *local_258;
  word local_218;
  ReaderFor<DynamicStruct> local_210;
  undefined1 local_1d8 [16];
  Maybe<kj::_::Mutex::Waiter_&> MStack_1c8;
  ArrayDisposer *pAStack_1c0;
  ReaderFor<DynamicList> local_e8;
  ArrayPtr<const_capnp::word> local_a8;
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  local_90;
  int iVar11;
  RawSchema *__return_storage_ptr___00;
  
  local_2a8.pos = name.content.ptr;
  if (this->flat == true) {
    FVar10 = this->packed | FLAT;
  }
  else {
    FVar10 = PACKED;
    if (this->packed == false) {
      FVar10 = BINARY;
      if (this->binary == false) {
        FVar10 = this->convertTo;
      }
    }
  }
  this->convertTo = FVar10;
  if ((long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr != 0x20) {
    local_90.first.subParser.first =
         (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
          *)0x0;
    local_1d8._0_8_ = (_func_int **)0x0;
    local_1d8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_90,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_90);
  }
  local_90.first.subParser.first =
       (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
        *)kj::parse::identifier;
  local_90.first.subParser.rest.first.subParser.rest.first =
       (Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
        *)kj::parse::integer;
  local_90.first.subParser.rest.rest.first.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.first.subParser.rest.rest.first.rest.first.rest.first.subParser =
       (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_2a8.end = local_2a8.pos + (name.content.size_ - 1);
  local_2a8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  pAVar27 = (ArrayDisposer *)0x0;
  params = (Dependency *)0x0;
  MVar26.ptr = (Waiter *)0x0;
  local_2a8.best = local_2a8.pos;
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
             (local_398 + 0x50),&local_90,&local_2a8);
  cVar8 = local_348[0];
  local_1d8[0] = local_348[0];
  if (local_348[0] == '\x01') {
    local_1d8._8_8_ = local_340;
    MStack_1c8.ptr = pWStack_338;
    pAStack_1c0 = pAStack_330;
    local_340 = (Dependency *)0x0;
    pWStack_338 = (Waiter *)0x0;
    if (params != (Dependency *)0x0) {
      (*(code *)(((Waiter *)pAVar27->_vptr_ArrayDisposer)->next).ptr)
                (pAVar27,params,0x30,MVar26.ptr,MVar26.ptr,
                 kj::ArrayDisposer::
                 Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>,_false>::destruct);
    }
    MVar26.ptr = MStack_1c8.ptr;
    params = (Dependency *)local_1d8._8_8_;
    local_1d8._8_8_ = (char *)0x0;
    MStack_1c8.ptr = (Waiter *)0x0;
    pAVar27 = pAStack_1c0;
  }
  else {
    kj::heapString((String *)(local_398 + 0x50),"invalid syntax",0xe);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)CONCAT44(local_348._4_4_,local_348._0_4_);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = (size_t)local_340;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         (ArrayDisposer *)pWStack_338;
  }
  MVar7.ptr = MStack_1c8.ptr;
  uVar22 = local_1d8._8_8_;
  if ((local_1d8[0] == '\x01') && ((char *)local_1d8._8_8_ != (char *)0x0)) {
    local_1d8._8_8_ = (char *)0x0;
    MStack_1c8.ptr = (Waiter *)0x0;
    (*(code *)(((Waiter *)pAStack_1c0->_vptr_ArrayDisposer)->next).ptr)
              (pAStack_1c0,uVar22,0x30,MVar7.ptr,MVar7.ptr,
               kj::ArrayDisposer::
               Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>,_false>::destruct);
  }
  pDVar25 = params;
  if (cVar8 == '\0') goto LAB_001a0af4;
  pcVar13 = (char *)((this->sourceFiles).builder.ptr)->id;
  if (MVar26.ptr == (Waiter *)0x0) {
    bVar18 = false;
  }
  else {
    bVar18 = false;
    do {
      pcVar12 = "";
      if (params->schema != (RawBrandedSchema *)0x0) {
        pcVar12 = *(char **)&params->location;
      }
      SVar21.content.size_ = (size_t)pcVar12;
      SVar21.content.ptr = pcVar13;
      Compiler::lookup((Compiler *)local_1d8,(uint64_t)(this->compiler).ptr,SVar21);
      if (local_1d8[0] == '\x01') {
        bVar20 = *(long *)(params + 2) == 0;
        pcVar13 = (char *)local_1d8._8_8_;
        if (!bVar20) {
          bVar18 = true;
        }
      }
      else {
        bVar20 = false;
      }
    } while ((bVar20) && (params = params + 3, params != pDVar25 + (long)MVar26.ptr * 3));
  }
  local_268 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  uStack_260 = 0x7fffffff;
  uVar22 = (RawBrandedSchema *)0x0;
  auVar5 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar5._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar5._8_8_;
  brand._reader.data = (void *)auVar5._16_8_;
  brand._reader.pointers = (WirePointer *)auVar5._24_8_;
  brand._reader.dataSize = auVar5._32_4_;
  brand._reader.pointerCount = auVar5._36_2_;
  brand._reader._38_2_ = auVar5._38_2_;
  local_3b8 = SchemaLoader::get(&((this->compiler).ptr)->loader,(uint64_t)pcVar13,brand,
                                (Schema)0x2cf728);
  local_348._0_4_ = 0;
  local_a8.ptr = &local_218;
  local_218.content = 0;
  local_a8.size_ = 1;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  __return_storage_ptr___00 = (RawSchema *)0x40;
  segments_00.size_ = 1;
  segments_00.ptr = &local_a8;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_1d8,segments_00,options);
  Schema::getProto((Reader *)&stack0xfffffffffffffbf8,&local_3b8);
  if (aStack_400._24_4_ < 0x70) {
    sVar9 = 0;
  }
  else {
    sVar9 = *(short *)(aStack_400.textValue.super_StringPtr.content.size_ + 0xc);
  }
  if (sVar9 == 1) {
    if (params != pDVar25 + (long)MVar26.ptr * 3) {
      Schema::asStruct(&local_3b8);
      MessageReader::getRootInternal((Reader *)local_2e8,(MessageReader *)local_1d8);
      reader_00.capTable = (CapTableReader *)in_stack_fffffffffffffbc8;
      reader_00.segment = (SegmentReader *)in_stack_fffffffffffffbc0;
      reader_00.pointer = (WirePointer *)in_stack_fffffffffffffbd0;
      reader_00._24_8_ = pDVar25;
      uVar22 = local_2e8._0_8_;
      capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (reader_00,(StructSchema)local_2e8._8_8_);
      in_stack_fffffffffffffbf8 = STRUCT;
      aStack_400.intValue = CONCAT17(local_398[7],local_398._0_7_);
      aStack_400.textValue.super_StringPtr.content.size_ = CONCAT17(local_398[0xf],local_398._8_7_);
      aStack_400.capabilityValue.schema.super_Schema.raw =
           (InterfaceSchema)CONCAT17(local_398[0x17],local_398._16_7_);
      aStack_400.listValue.reader.capTable =
           (CapTableReader *)CONCAT17(local_398[0x1f],local_398._24_7_);
      aStack_400.listValue.reader.ptr = (byte *)CONCAT17(local_398[0x27],local_398._32_7_);
      aStack_400._40_8_ = CONCAT44(local_398._44_4_,local_398._40_4_);
      aStack_400._48_8_ = CONCAT17(local_398[0x37],local_398._48_7_);
      DynamicValue::Reader::operator=
                ((Reader *)(local_398 + 0x50),(Reader *)&stack0xfffffffffffffbf8);
      DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffbf8);
      params_00 = extraout_RDX_00;
      goto LAB_001a03d3;
    }
    SVar21 = Schema::getShortDisplayName(&local_3b8);
    local_398._0_7_ = SVar21.content.ptr._0_7_;
    local_398[7] = SVar21.content.ptr._7_1_;
    local_398._8_7_ = (undefined7)SVar21.content.size_;
    local_398[0xf] = SVar21.content.size_._7_1_;
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
              ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,(char (*) [2])local_398,
               (StringPtr *)"\' cannot be evaluated.",(char (*) [23])local_398);
  }
  else {
    if (sVar9 == 4) {
      constant = Schema::asConst(&local_3b8);
      DynamicValue::Reader::Reader((Reader *)&stack0xfffffffffffffbf8,constant);
      DynamicValue::Reader::operator=
                ((Reader *)(local_398 + 0x50),(Reader *)&stack0xfffffffffffffbf8);
      DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffbf8);
      params_00 = extraout_RDX;
LAB_001a03d3:
      pRVar23 = (RawSchema *)__return_storage_ptr__;
      pDVar24 = (Dependency *)in_stack_fffffffffffffbc8;
      if (params != pDVar25 + (long)MVar26.ptr * 3) {
        do {
          pRVar2 = params->schema;
          pcVar13 = "";
          if (pRVar2 != (RawBrandedSchema *)0x0) {
            pcVar13 = *(char **)&params->location;
          }
          local_3a8._8_8_ = (long)&pRVar2->generic + (ulong)(pRVar2 == (RawBrandedSchema *)0x0);
          local_3b0 = params;
          local_3a8._0_8_ = pcVar13;
          if (bVar18) {
LAB_001a0440:
            local_449 = (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).
                        isSet;
            bVar20 = *(long *)(params + 2) == 0;
            if (bVar20) {
              bVar18 = false;
            }
            else {
              in_stack_fffffffffffffbd0 =
                   (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
                    &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr;
              ppDVar1 = (Dependency **)&((RawSchema *)__return_storage_ptr__)->encodedSize;
              pRVar16 = (RawSchema *)0x0;
              pRVar19 = (RawSchema *)0x1;
              __return_storage_ptr__ = (Validity *)pRVar23;
              pDVar24 = *ppDVar1;
              do {
                in_stack_fffffffffffffbc8 = aStack_400.intValue;
                SVar3.raw = local_3b0[1].schema;
                if (local_348._0_4_ != 8) {
                  *(Dependency **)&((RawSchema *)__return_storage_ptr__)->encodedSize = pDVar24;
                  (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
                   &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
                       in_stack_fffffffffffffbd0;
                  (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet =
                       (bool)local_449;
                  if ((int)pRVar19 == 1) {
                    kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                              ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,
                               (char (*) [2])local_3a8,(StringPtr *)0x262b75,
                               (char (*) [17])__return_storage_ptr___00);
                    (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet =
                         true;
                    (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
                     &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
                         (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
                    *(int64_t *)&((RawSchema *)__return_storage_ptr__)->encodedSize =
                         aStack_400.intValue;
                    ((RawSchema *)__return_storage_ptr__)->dependencies =
                         (RawSchema **)aStack_400.textValue.super_StringPtr.content.size_;
                    params_00 = extraout_RDX_06;
                    pRVar23 = (RawSchema *)__return_storage_ptr__;
                  }
                  else {
                    __return_storage_ptr___00 = (RawSchema *)local_398;
                    local_2e8._0_8_ = SVar3.raw;
                    local_2e8._8_8_ = pRVar16;
                    kj::strArray<kj::ArrayPtr<unsigned_long>>
                              ((String *)__return_storage_ptr___00,(kj *)local_2e8,
                               (ArrayPtr<unsigned_long> *)"][",(char *)__return_storage_ptr__);
                    kj::
                    str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                              ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,
                               (char (*) [2])local_3a8,(StringPtr *)0x262b5d,
                               (char (*) [2])__return_storage_ptr___00,
                               (String *)"]\' is not a list.",(char (*) [18])uVar22);
                    (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet =
                         true;
                    (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
                     &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
                         (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
                    *(int64_t *)&((RawSchema *)__return_storage_ptr__)->encodedSize =
                         aStack_400.intValue;
                    ((RawSchema *)__return_storage_ptr__)->dependencies =
                         (RawSchema **)aStack_400.textValue.super_StringPtr.content.size_;
                    in_stack_fffffffffffffbf8 = UNKNOWN;
                    in_stack_fffffffffffffbfc = 0;
                    aStack_400.intValue = 0;
                    lVar15 = CONCAT17(local_398[7],local_398._0_7_);
                    params_00 = extraout_RDX_08;
                    pRVar23 = (RawSchema *)__return_storage_ptr__;
                    if (lVar15 != 0) {
                      __return_storage_ptr___00 =
                           (RawSchema *)CONCAT17(local_398[0xf],local_398._8_7_);
                      local_398._0_2_ = VOID;
                      local_398[2] = '\0';
                      local_398[3] = false;
                      local_398._4_2_ = (anon_union_2_2_d12d5221_for_Type_3)0x0;
                      local_398[6] = 0;
                      local_398[7] = 0;
                      local_398._8_7_ = 0;
                      local_398[0xf] = 0;
                      (*(code *)**(undefined8 **)CONCAT17(local_398[0x17],local_398._16_7_))
                                ((undefined8 *)CONCAT17(local_398[0x17],local_398._16_7_),lVar15,1,
                                 __return_storage_ptr___00,__return_storage_ptr___00,0);
                      params_00 = extraout_RDX_09;
                    }
                  }
                  goto LAB_001a0861;
                }
                pRVar23 = (&(SVar3.raw)->generic)[(long)pRVar16];
                DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                          ((ReaderFor<DynamicList> *)local_398,(Reader *)(local_398 + 0x50));
                pRVar16 = (RawSchema *)(ulong)(uint)local_398._40_4_;
                if (pRVar23 < pRVar16) {
                  DynamicList::Reader::operator[]
                            ((Reader *)&stack0xfffffffffffffbf8,(Reader *)local_398,(uint)pRVar23);
                  DynamicValue::Reader::operator=
                            ((Reader *)(local_398 + 0x50),(Reader *)&stack0xfffffffffffffbf8);
                  DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffbf8);
                  params_00 = extraout_RDX_01;
                  in_stack_fffffffffffffbc8 = pDVar24;
                }
                else {
                  local_2f8.super_Schema.raw = (Schema)local_3b0[1].schema;
                  __return_storage_ptr___00 = (RawSchema *)local_2e8;
                  local_2f0 = pRVar19;
                  kj::strArray<kj::ArrayPtr<unsigned_long>>
                            ((String *)__return_storage_ptr___00,(kj *)&local_2f8,
                             (ArrayPtr<unsigned_long> *)"][",pcVar13);
                  kj::
                  str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                            ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,
                             (char (*) [2])local_3a8,(StringPtr *)0x262b5d,
                             (char (*) [2])__return_storage_ptr___00,
                             (String *)"]\' is out-of-bounds.",(char (*) [21])uVar22);
                  pRVar14 = (RawSchema *)local_2e8._8_8_;
                  uVar6 = local_2e8._0_8_;
                  in_stack_fffffffffffffbd0 =
                       (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
                  ((RawSchema *)__return_storage_ptr__)->dependencies =
                       (RawSchema **)aStack_400.textValue.super_StringPtr.content.size_;
                  in_stack_fffffffffffffbf8 = UNKNOWN;
                  in_stack_fffffffffffffbfc = 0;
                  aStack_400.intValue = 0;
                  pcVar13 = (char *)__return_storage_ptr__;
                  params_00 = extraout_RDX_02;
                  if ((RawBrandedSchema *)local_2e8._0_8_ != (RawBrandedSchema *)0x0) {
                    local_2e8._0_8_ = (RawBrandedSchema *)0x0;
                    local_2e8._8_8_ = (RawSchema *)0x0;
                    __return_storage_ptr___00 = pRVar14;
                    (**(code **)*(WirePointer *)local_2e8._16_8_)
                              (local_2e8._16_8_,uVar6,1,pRVar14,pRVar14,0);
                    pcVar13 = (char *)pRVar14;
                    params_00 = extraout_RDX_03;
                  }
                  local_449 = 1;
                }
                if (pRVar16 <= pRVar23) goto LAB_001a07e3;
                bVar20 = *(RawSchema **)(local_3b0 + 2) <= pRVar19;
                bVar4 = pRVar19 < *(RawSchema **)(local_3b0 + 2);
                pRVar16 = pRVar19;
                pRVar19 = (RawSchema *)(ulong)((int)pRVar19 + 1);
                pDVar24 = (Dependency *)in_stack_fffffffffffffbc8;
              } while (bVar4);
              bVar18 = false;
LAB_001a07e3:
              *(undefined8 *)&((RawSchema *)__return_storage_ptr__)->encodedSize =
                   in_stack_fffffffffffffbc8;
              (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
               &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
                   in_stack_fffffffffffffbd0;
              pRVar23 = (RawSchema *)__return_storage_ptr__;
            }
            (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet =
                 (bool)local_449;
            pDVar24 = (Dependency *)in_stack_fffffffffffffbc8;
          }
          else {
            if (local_348._0_4_ == 10) {
              DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                        ((ReaderFor<DynamicStruct> *)local_2e8,(Reader *)(local_398 + 0x50));
              local_2f8.super_Schema.raw = (Schema)(Schema)local_2e8._0_8_;
              name_00.content.size_ = local_3a8._8_8_;
              name_00.content.ptr = (char *)local_3a8._0_8_;
              pcVar13 = (char *)local_3a8._8_8_;
              StructSchema::findFieldByName
                        ((Maybe<capnp::StructSchema::Field> *)&stack0xfffffffffffffbf8,&local_2f8,
                         name_00);
              uVar28 = (undefined1)in_stack_fffffffffffffbf8;
              if (uVar28 == VOID) {
                local_398[0x37] = (undefined1)aStack_400._48_8_;
                local_398._56_7_ = (undefined7)((ulong)aStack_400._48_8_ >> 8);
                local_398[0x27] = SUB81(aStack_400.listValue.reader.ptr,0);
                local_398._40_4_ = (undefined4)((ulong)aStack_400._32_8_ >> 8);
                local_398._44_3_ = (undefined3)((ulong)aStack_400._32_8_ >> 0x28);
                local_398[0x2f] = (undefined1)aStack_400._40_8_;
                local_398._48_7_ = (undefined7)((ulong)aStack_400._40_8_ >> 8);
                local_398[0x17] = SUB81(aStack_400.listValue.reader.segment,0);
                local_398._24_7_ = (undefined7)((ulong)aStack_400._16_8_ >> 8);
                local_398[0x1f] = SUB81(aStack_400.listValue.reader.capTable,0);
                local_398._32_7_ = (undefined7)((ulong)aStack_400._24_8_ >> 8);
                local_398[7] = (undefined1)aStack_400.intValue;
                local_398._8_7_ = (undefined7)((ulong)aStack_400._0_8_ >> 8);
                local_398[0xf] = (undefined1)aStack_400.textValue.super_StringPtr.content.size_;
                local_398._16_7_ = (undefined7)((ulong)aStack_400._8_8_ >> 8);
                local_258 = (Dependency *)aStack_400.intValue;
                field._8_8_ = aStack_400.textValue.super_StringPtr.content.size_;
                field.parent.super_Schema.raw = (Schema)(Schema)aStack_400.intValue;
                field.proto._reader.segment = aStack_400.listValue.reader.segment;
                field.proto._reader.capTable = aStack_400.listValue.reader.capTable;
                field.proto._reader.data = aStack_400.listValue.reader.ptr;
                field.proto._reader.pointers = (WirePointer *)aStack_400._40_8_;
                field.proto._reader.dataSize = aStack_400.listValue.reader.structDataSize;
                field.proto._reader.pointerCount = aStack_400.listValue.reader.structPointerCount;
                field.proto._reader._38_2_ = aStack_400._54_2_;
                field.proto._reader._40_8_ = aStack_400._56_8_;
                uVar22 = aStack_400.textValue.super_StringPtr.content.ptr;
                DynamicStruct::Reader::get
                          ((Reader *)&stack0xfffffffffffffbf8,(ReaderFor<DynamicStruct> *)local_2e8,
                           field);
                DynamicValue::Reader::operator=
                          ((Reader *)(local_398 + 0x50),(Reader *)&stack0xfffffffffffffbf8);
                DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffbf8);
                params_00 = extraout_RDX_04;
              }
              else {
                pcVar13 = "\' has no member \'";
                __return_storage_ptr___00 = (RawSchema *)local_3a8;
                kj::
                str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                          ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,
                           (char (*) [2])(params + -3),(String *)"\' has no member \'",
                           (char (*) [18])__return_storage_ptr___00,(StringPtr *)0x268cfb,
                           (char (*) [3])uVar22);
                (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet =
                     true;
                (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
                 &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
                     (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
                *(int64_t *)&((RawSchema *)__return_storage_ptr__)->encodedSize =
                     aStack_400.intValue;
                ((RawSchema *)__return_storage_ptr__)->dependencies =
                     (RawSchema **)aStack_400.textValue.super_StringPtr.content.size_;
                params_00 = extraout_RDX_07;
              }
              pDVar24 = (Dependency *)in_stack_fffffffffffffbc8;
              if (uVar28 != UNKNOWN) goto LAB_001a0440;
            }
            else {
              kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                        ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,
                         (char (*) [2])(params + -3),(String *)"\' is not a struct.",
                         (char (*) [19])__return_storage_ptr___00);
              (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet = true;
              (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
               &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
                   (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
              *(int64_t *)&((RawSchema *)__return_storage_ptr__)->encodedSize = aStack_400.intValue;
              ((RawSchema *)__return_storage_ptr__)->dependencies =
                   (RawSchema **)aStack_400.textValue.super_StringPtr.content.size_;
              params_00 = extraout_RDX_05;
              pDVar24 = (Dependency *)in_stack_fffffffffffffbc8;
            }
            bVar20 = false;
          }
LAB_001a0861:
          if (!bVar20) goto LAB_001a0ada;
          params = local_3b0 + 3;
          in_stack_fffffffffffffbc0 = pRVar23;
          in_stack_fffffffffffffbc8 = pDVar24;
        } while (params != pDVar25 + (long)MVar26.ptr * 3);
      }
      if (this->convertTo == TEXT) {
        cVar8 = this->pretty;
        if (((bool)cVar8 != true) || (local_348._0_4_ != 10)) goto LAB_001a0ced;
        pPVar17 = this->context;
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&local_210,(Reader *)(local_398 + 0x50));
        value_00.reader.segment = (SegmentReader *)pDVar24;
        value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffbc0;
        value_00.reader.capTable = (CapTableReader *)in_stack_fffffffffffffbd0;
        value_00.reader.data = pDVar25;
        value_00.reader.pointers = (WirePointer *)MVar26.ptr;
        value_00.reader._32_8_ = pAVar27;
        value_00.reader._40_8_ = in_stack_fffffffffffffbf0;
        prettyPrint(value_00);
        kj::StringTree::flatten((String *)local_398,(StringTree *)&stack0xfffffffffffffbf8);
        lVar15 = CONCAT17(local_398[0xf],local_398._8_7_);
        if (lVar15 == 0) goto LAB_001a0dd1;
        pcVar13 = (char *)CONCAT17(local_398[7],local_398._0_7_);
LAB_001a0dd8:
        (*pPVar17->_vptr_ProcessContext[5])(pPVar17,pcVar13,lVar15 + (ulong)(lVar15 == 0));
        lVar15 = extraout_RDX_12;
      }
      else {
        if (local_348._0_4_ != 10) {
          kj::heapString((String *)&stack0xfffffffffffffbf8,
                         "not a struct; binary output is only available on structs",0x38);
          goto LAB_001a0ab1;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&stack0xfffffffffffffbf8,(Reader *)(local_398 + 0x50)
                  );
        (this->rootType).super_Schema.raw =
             (RawBrandedSchema *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
        kj::FdOutputStream::FdOutputStream((FdOutputStream *)local_398,1);
        reader._reader.capTable =
             (CapTableReader *)aStack_400.textValue.super_StringPtr.content.size_;
        reader._reader.segment = (SegmentReader *)aStack_400.intValue;
        reader._reader.data = aStack_400.listValue.reader.segment;
        reader._reader.pointers = (WirePointer *)aStack_400.listValue.reader.capTable;
        reader._reader._32_8_ = aStack_400.listValue.reader.ptr;
        reader._reader._40_8_ = aStack_400._40_8_;
        writeConversion(this,reader,(OutputStream *)local_398);
        iVar11 = (*this->context->_vptr_ProcessContext[1])();
        cVar8 = (char)iVar11;
        params_00 = extraout_RDX_10;
LAB_001a0ced:
        pPVar17 = this->context;
        if ((cVar8 == '\0') || (local_348._0_4_ != 8)) {
          kj::str<capnp::DynamicValue::Reader&>
                    ((String *)&stack0xfffffffffffffbf8,(kj *)(local_398 + 0x50),params_00);
          if (aStack_400._0_8_ == (Dependency *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
          }
          (*pPVar17->_vptr_ProcessContext[5])
                    (pPVar17,pcVar13,
                     aStack_400.textValue.super_StringPtr.content.ptr +
                     (aStack_400._0_8_ == (Dependency *)0x0));
          lVar15 = extraout_RDX_11;
LAB_001a0dd1:
          pcVar13 = "";
          goto LAB_001a0dd8;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                  (&local_e8,(Reader *)(local_398 + 0x50));
        value_01.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pDVar24;
        value_01.schema.elementType._0_8_ = in_stack_fffffffffffffbc0;
        value_01.reader.segment = (SegmentReader *)in_stack_fffffffffffffbd0;
        value_01.reader.capTable = (CapTableReader *)pDVar25;
        value_01.reader.ptr = (byte *)MVar26.ptr;
        value_01.reader._24_8_ = pAVar27;
        value_01.reader.structDataSize = (int)in_stack_fffffffffffffbf0;
        value_01.reader.structPointerCount = (short)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
        value_01.reader.elementSize = (char)((ulong)in_stack_fffffffffffffbf0 >> 0x30);
        value_01.reader._39_1_ = (char)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
        value_01.reader.nestingLimit = in_stack_fffffffffffffbf8;
        value_01.reader._44_4_ = in_stack_fffffffffffffbfc;
        prettyPrint(value_01);
        kj::StringTree::flatten((String *)local_398,(StringTree *)&stack0xfffffffffffffbf8);
        lVar15 = CONCAT17(local_398[0xf],local_398._8_7_);
        if (lVar15 != 0) {
          pcVar13 = (char *)CONCAT17(local_398[7],local_398._0_7_);
          goto LAB_001a0df0;
        }
      }
      pcVar13 = "";
LAB_001a0df0:
      iVar11 = (*pPVar17->_vptr_ProcessContext[5])(pPVar17,pcVar13,lVar15 + (ulong)(lVar15 == 0));
      kj::String::~String((String *)local_398);
      kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffbf8);
      SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_1d8);
      DynamicValue::Reader::~Reader((Reader *)(local_398 + 0x50));
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
                ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                 &stack0xfffffffffffffbd8);
      if (local_2a8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
        pcVar13 = local_2a8.best;
        if (local_2a8.best < local_2a8.pos) {
          pcVar13 = local_2a8.pos;
        }
        if (pcVar13 <= (local_2a8.parent)->best) {
          pcVar13 = (local_2a8.parent)->best;
        }
        (local_2a8.parent)->best = pcVar13;
      }
      _Unwind_Resume(iVar11);
    }
    if (bVar18) {
      SVar21 = Schema::getShortDisplayName(&local_3b8);
      local_398._0_7_ = SVar21.content.ptr._0_7_;
      local_398[7] = SVar21.content.ptr._7_1_;
      local_398._8_7_ = (undefined7)SVar21.content.size_;
      local_398[0xf] = SVar21.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
                ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,(char (*) [2])local_398,
                 (StringPtr *)0x262b75,(char (*) [17])local_398);
    }
    else if (params == pDVar25 + (long)MVar26.ptr * 3) {
      SVar21 = Schema::getShortDisplayName(&local_3b8);
      local_398._0_7_ = SVar21.content.ptr._0_7_;
      local_398[7] = SVar21.content.ptr._7_1_;
      local_398._8_7_ = (undefined7)SVar21.content.size_;
      local_398[0xf] = SVar21.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,(char (*) [2])local_398,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])local_398);
    }
    else {
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                ((String *)&stack0xfffffffffffffbf8,(kj *)0x272fcb,(char (*) [2])params,
                 (String *)"\' is not defined.",(char (*) [18])__return_storage_ptr___00);
    }
  }
LAB_001a0ab1:
  (((Maybe<kj::String> *)&((RawSchema *)__return_storage_ptr__)->id)->ptr).isSet = true;
  (((anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)
   &((RawSchema *)__return_storage_ptr__)->encodedNode)->value).content.ptr =
       (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8);
  *(int64_t *)&((RawSchema *)__return_storage_ptr__)->encodedSize = aStack_400.intValue;
  ((RawSchema *)__return_storage_ptr__)->dependencies =
       (RawSchema **)aStack_400.textValue.super_StringPtr.content.size_;
LAB_001a0ada:
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_1d8);
  DynamicValue::Reader::~Reader((Reader *)(local_398 + 0x50));
LAB_001a0af4:
  if (pDVar25 != (Dependency *)0x0) {
    (*(code *)(((Waiter *)pAVar27->_vptr_ArrayDisposer)->next).ptr)
              (pAVar27,pDVar25,0x30,MVar26.ptr,MVar26.ptr,
               kj::ArrayDisposer::
               Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>,_false>::destruct);
  }
  if (local_2a8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_2a8.best < local_2a8.pos) {
      local_2a8.best = local_2a8.pos;
    }
    if (local_2a8.best <= (local_2a8.parent)->best) {
      local_2a8.best = (local_2a8.parent)->best;
    }
    (local_2a8.parent)->best = local_2a8.best;
  }
  return (Validity *)(RawSchema *)__return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_MAYBE(p, parser(input)) {
      nameParts = kj::mv(*p);
    } else {
      return "invalid syntax";
    }